

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_for.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  long in_RSI;
  int in_EDI;
  int in_stack_000002c4;
  int in_stack_000002d4;
  
  if (in_EDI != 2) {
    this = std::operator<<((ostream *)&std::cerr,"Usage: ./parallel_for num_iterations");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  atoi(*(char **)(in_RSI + 8));
  for_each(in_stack_000002c4);
  atoi(*(char **)(in_RSI + 8));
  for_each_by_index(in_stack_000002d4);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  if(argc != 2) {
    std::cerr << "Usage: ./parallel_for num_iterations" << std::endl;
    std::exit(EXIT_FAILURE);
  }

  for_each(std::atoi(argv[1]));
  for_each_by_index(std::atoi(argv[1]));

  return 0;
}